

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

int __thiscall Fl_Help_View::load(Fl_Help_View *this,char *f)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  size_t __n;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  char newname [2048];
  char error [1024];
  char urimsg [2048];
  char acStack_1428 [2048];
  char local_c28 [1024];
  char local_828 [2048];
  
  iVar1 = strncmp(f,"ftp:",4);
  if (((((iVar1 == 0) || (iVar1 = strncmp(f,"http:",5), iVar1 == 0)) ||
       (iVar1 = strncmp(f,"https:",6), iVar1 == 0)) ||
      ((iVar1 = strncmp(f,"ipp:",4), iVar1 == 0 || (iVar1 = strncmp(f,"mailto:",7), iVar1 == 0))))
     || (iVar1 = strncmp(f,"news:",5), iVar1 == 0)) {
    iVar1 = fl_open_uri(f,local_828,0x800);
    if (iVar1 == 0) {
      if (current_view == this) {
        clear_global_selection(this);
      }
      fl_strlcpy(acStack_1428,f,0x800);
      pcVar2 = strrchr(acStack_1428,0x23);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      if ((this->link_ == (Fl_Help_Func *)0x0) ||
         (pcVar2 = (*this->link_)((Fl_Widget *)this,acStack_1428), pcVar2 != (char *)0x0)) {
        free_data(this);
        fl_strlcpy(this->filename_,acStack_1428,0x800);
        pcVar2 = this->directory_;
        fl_strlcpy(pcVar2,acStack_1428,0x800);
        pcVar6 = strrchr(pcVar2,0x2f);
        if (pcVar6 == (char *)0x0) {
          *pcVar2 = '\0';
        }
        else if ((pcVar2 < pcVar6) && (pcVar6[-1] != '/')) {
          *pcVar6 = '\0';
        }
        snprintf(local_c28,0x400,
                 "<HTML><HEAD><TITLE>Error</TITLE></HEAD><BODY><H1>Error</H1><P>Unable to follow the link \"%s\" - %s.</P></BODY>"
                 ,f,local_828);
        value(this,local_c28);
      }
    }
  }
  else {
    if (current_view == this) {
      clear_global_selection(this);
    }
    fl_strlcpy(acStack_1428,f,0x800);
    pcVar2 = strrchr(acStack_1428,0x23);
    if (pcVar2 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    if (this->link_ == (Fl_Help_Func *)0x0) {
      pcVar2 = this->filename_;
    }
    else {
      pcVar2 = (*this->link_)((Fl_Widget *)this,acStack_1428);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
    }
    free_data(this);
    fl_strlcpy(this->filename_,acStack_1428,0x800);
    pcVar5 = this->directory_;
    fl_strlcpy(pcVar5,acStack_1428,0x800);
    pcVar3 = strrchr(pcVar5,0x2f);
    if (pcVar3 == (char *)0x0) {
      *pcVar5 = '\0';
    }
    else if ((pcVar5 < pcVar3) && (pcVar3[-1] != '/')) {
      *pcVar3 = '\0';
    }
    iVar1 = strncmp(pcVar2,"file:",5);
    __stream = (FILE *)fl_fopen(pcVar2 + (ulong)(iVar1 == 0) * 5,"rb");
    if (__stream == (FILE *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      snprintf(local_c28,0x400,
               "<HTML><HEAD><TITLE>Error</TITLE></HEAD><BODY><H1>Error</H1><P>Unable to follow the link \"%s\" - %s.</P></BODY>"
               ,pcVar2 + (ulong)(iVar1 == 0) * 5,pcVar5);
      pcVar2 = strdup(local_c28);
      this->value_ = pcVar2;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      rewind(__stream);
      pcVar2 = (char *)calloc(__n + 1,1);
      this->value_ = pcVar2;
      fread(pcVar2,1,__n,__stream);
      fclose(__stream);
    }
    initial_load = 1;
    format(this);
    initial_load = 0;
    if (pcVar6 == (char *)0x0) {
      topline(this,0);
    }
    else {
      topline(this,pcVar6);
    }
  }
  return 0;
}

Assistant:

int				// O - 0 on success, -1 on error
Fl_Help_View::load(const char *f)// I - Filename to load (may also have target)
{
  FILE		*fp;		// File to read from
  long		len;		// Length of file
  char		*target;	// Target in file
  char		*slash;		// Directory separator
  const char	*localname;	// Local filename
  char		error[1024];	// Error buffer
  char		newname[FL_PATH_MAX];	// New filename buffer

  // printf("load(%s)\n",f); fflush(stdout);

  if (strncmp(f, "ftp:", 4) == 0 ||
      strncmp(f, "http:", 5) == 0 ||
      strncmp(f, "https:", 6) == 0 ||
      strncmp(f, "ipp:", 4) == 0 ||
      strncmp(f, "mailto:", 7) == 0 ||
      strncmp(f, "news:", 5) == 0) {
    char urimsg[FL_PATH_MAX];
    if ( fl_open_uri(f, urimsg, sizeof(urimsg)) == 0 ) {
      clear_selection();

      strlcpy(newname, f, sizeof(newname));
      if ((target = strrchr(newname, '#')) != NULL)
	*target++ = '\0';

      if (link_)
	localname = (*link_)(this, newname);
      else
	localname = filename_;

      if (!localname)
	return (0);

      free_data();

      strlcpy(filename_, newname, sizeof(filename_));
      strlcpy(directory_, newname, sizeof(directory_));

      // Note: We do not support Windows backslashes, since they are illegal
      //       in URLs...
      if ((slash = strrchr(directory_, '/')) == NULL)
	directory_[0] = '\0';
      else if (slash > directory_ && slash[-1] != '/')
	*slash = '\0';

      snprintf(error, sizeof(error),
	       "<HTML><HEAD><TITLE>Error</TITLE></HEAD>"
	       "<BODY><H1>Error</H1>"
	       "<P>Unable to follow the link \"%s\" - "
	       "%s.</P></BODY>",
	       f, urimsg);
      value(error);
      //return(-1);
    }
    return(0);
  }

  clear_selection();

  strlcpy(newname, f, sizeof(newname));
  if ((target = strrchr(newname, '#')) != NULL)
    *target++ = '\0';

  if (link_)
    localname = (*link_)(this, newname);
  else
    localname = filename_;

  if (!localname)
    return (0);

  free_data();

  strlcpy(filename_, newname, sizeof(filename_));
  strlcpy(directory_, newname, sizeof(directory_));

  // Note: We do not support Windows backslashes, since they are illegal
  //       in URLs...
  if ((slash = strrchr(directory_, '/')) == NULL)
    directory_[0] = '\0';
  else if (slash > directory_ && slash[-1] != '/')
    *slash = '\0';

  if (strncmp(localname, "file:", 5) == 0)
    localname += 5;	// Adjust for local filename...

  if ((fp = fl_fopen(localname, "rb")) != NULL)
  {
    fseek(fp, 0, SEEK_END);
    len = ftell(fp);
    rewind(fp);

    value_ = (const char *)calloc(len + 1, 1);
    if (fread((void *)value_, 1, len, fp)==0) { /* use default 0 */ }
    fclose(fp);
  }
  else
  {
    snprintf(error, sizeof(error),
	     "<HTML><HEAD><TITLE>Error</TITLE></HEAD>"
	     "<BODY><H1>Error</H1>"
	     "<P>Unable to follow the link \"%s\" - "
	     "%s.</P></BODY>",
	     localname, strerror(errno));
    value_ = strdup(error);
  }

  initial_load = 1;
  format();
  initial_load = 0;

  if (target)
    topline(target);
  else
    topline(0);

  return (0);
}